

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::BindReference(ScriptContext *this,void *addr)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  void *local_30;
  void *local_28;
  void *addr_local;
  
  local_28 = addr;
  if ((this->super_ScriptContextBase).isClosed == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1353,"(!this->isClosed)","!this->isClosed");
    if (!bVar2) goto LAB_00792a40;
    *puVar4 = 0;
  }
  BVar3 = Memory::Recycler::IsValidObject(this->recycler,local_28,0);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1354,"(recycler->IsValidObject(addr))",
                                "recycler->IsValidObject(addr)");
    if (!bVar2) goto LAB_00792a40;
    *puVar4 = 0;
  }
  bVar2 = JsUtil::
          BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(&(this->bindRef).
                         super_BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        ,&local_28);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x1356,"(!bindRef.ContainsKey(addr))","!bindRef.ContainsKey(addr)")
    ;
    if (!bVar2) {
LAB_00792a40:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_30 = local_28;
  JsUtil::
  BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
            ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              *)&this->bindRef,&local_30,&local_28);
  JavascriptLibrary::BindReference((this->super_ScriptContextBase).javascriptLibrary,local_28);
  return;
}

Assistant:

void ScriptContext::BindReference(void * addr)
    {
        Assert(!this->isClosed);
        Assert(recycler->IsValidObject(addr));
#if DBG
        Assert(!bindRef.ContainsKey(addr));     // Make sure we don't bind the same pointer twice
        bindRef.AddNew(addr);
#endif
        javascriptLibrary->BindReference(addr);

#ifdef RECYCLER_PERF_COUNTERS
        this->bindReferenceCount++;
        RECYCLER_PERF_COUNTER_INC(BindReference);
#endif
    }